

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hishelf2_reinit(ma_hishelf2_config *pConfig,ma_hishelf2 *pFilter)

{
  double dVar1;
  double dVar2;
  double __x;
  ma_result mVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ma_biquad_config bqConfig;
  ma_biquad_config local_48;
  
  mVar3 = MA_INVALID_ARGS;
  if (pConfig != (ma_hishelf2_config *)0x0 && pFilter != (ma_hishelf2 *)0x0) {
    dVar1 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
    dVar2 = sin(dVar1);
    dVar1 = sin(1.5707963267948966 - dVar1);
    __x = pow(10.0,pConfig->gainDB / 40.0);
    dVar4 = (1.0 / pConfig->shelfSlope + -1.0) * (1.0 / __x + __x) + 2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    if (__x < 0.0) {
      dVar5 = sqrt(__x);
    }
    else {
      dVar5 = SQRT(__x);
    }
    dVar6 = dVar2 * 0.5 * dVar4 * (dVar5 + dVar5);
    local_48.format = pConfig->format;
    local_48.channels = pConfig->channels;
    dVar4 = __x + -1.0;
    dVar5 = __x + 1.0;
    dVar2 = dVar4 * dVar1 + dVar5;
    local_48.b2 = (dVar2 - dVar6) * __x;
    local_48.a2 = dVar5 - dVar1 * dVar4;
    local_48.a1 = dVar4 - dVar1 * dVar5;
    local_48.a0 = local_48.a2 + dVar6;
    local_48.a1 = local_48.a1 + local_48.a1;
    local_48.a2 = local_48.a2 - dVar6;
    local_48.b0 = __x * (dVar2 + dVar6);
    local_48.b1 = (dVar5 * dVar1 + dVar4) * __x * -2.0;
    mVar3 = ma_biquad_reinit(&local_48,&pFilter->bq);
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_hishelf2_reinit(const ma_hishelf2_config* pConfig, ma_hishelf2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_hishelf2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}